

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor_rational.hpp
# Opt level: O0

void __thiscall
soplex::CLUFactorRational::factor(CLUFactorRational *this,SVectorRational **vec,Rational *threshold)

{
  bool bVar1;
  int iVar2;
  CLUFactorRational *in_RDI;
  CLUFactorRational *unaff_retaddr;
  CLUFactorRational *in_stack_00000008;
  CLUFactorRational *in_stack_00000030;
  CLUFactorRational *in_stack_00000060;
  CLUFactorRational *in_stack_000000a8;
  CLUFactorRational *in_stack_00000138;
  SVectorRational **in_stack_00000338;
  CLUFactorRational *in_stack_00000340;
  CLUFactorRational *in_stack_ffffffffffffffd8;
  CLUFactorRational *threshold_00;
  
  threshold_00 = in_RDI;
  SPxOut::debug<soplex::CLUFactorRational,_const_char_(&)[29],_0>
            (in_RDI,(char (*) [29])"CLUFactorRational::factor()\n");
  (*in_RDI->factorTime->_vptr_Timer[3])();
  in_RDI->stat = OK;
  *(in_RDI->l).start = 0;
  (in_RDI->l).firstUpdate = 0;
  (in_RDI->l).firstUnused = 0;
  Temp::init(&in_RDI->temp,(EVP_PKEY_CTX *)(ulong)(uint)in_RDI->thedim);
  initPerm(in_RDI);
  initFactorMatrix(in_stack_00000340,in_stack_00000338);
  if ((((in_RDI->stat == OK) && (bVar1 = timeLimitReached(in_stack_ffffffffffffffd8), !bVar1)) &&
      (colSingletons(in_stack_00000030), in_RDI->stat == OK)) &&
     (((bVar1 = timeLimitReached(in_stack_ffffffffffffffd8), !bVar1 &&
       (rowSingletons(in_stack_000000a8), in_RDI->stat == OK)) &&
      (((in_RDI->temp).stage < in_RDI->thedim &&
       (bVar1 = timeLimitReached(in_stack_ffffffffffffffd8), !bVar1)))))) {
    initFactorRings(in_stack_00000008);
    eliminateNucleus(unaff_retaddr,(Rational *)threshold_00);
    freeFactorRings(in_RDI);
  }
  (in_RDI->l).firstUpdate = (in_RDI->l).firstUnused;
  if (in_RDI->stat == OK) {
    setupRowVals(in_stack_00000060);
    iVar2 = setupColVals(in_stack_00000138);
    in_RDI->nzCnt = iVar2;
  }
  (*in_RDI->factorTime->_vptr_Timer[4])();
  in_RDI->factorCount = in_RDI->factorCount + 1;
  return;
}

Assistant:

inline void CLUFactorRational::factor(
   const SVectorRational** vec,         ///< Array of column vector pointers
   const Rational& threshold            ///< pivoting threshold
)
{
   SPxOut::debug(this, "CLUFactorRational::factor()\n");

   factorTime->start();

   stat = SLinSolverRational::OK;

   l.start[0]    = 0;
   l.firstUpdate = 0;
   l.firstUnused = 0;

   temp.init(thedim);
   initPerm();

   initFactorMatrix(vec);

   if(stat)
      goto TERMINATE;

   if(timeLimitReached())
      goto TERMINATE;

   //   initMaxabs = initMaxabs;

   colSingletons();

   if(stat != SLinSolverRational::OK)
      goto TERMINATE;

   if(timeLimitReached())
      goto TERMINATE;

   rowSingletons();

   if(stat != SLinSolverRational::OK)
      goto TERMINATE;

   if(temp.stage < thedim)
   {
      if(timeLimitReached())
         goto TERMINATE;

      initFactorRings();
      eliminateNucleus(threshold);
      freeFactorRings();
   }

TERMINATE:

   l.firstUpdate = l.firstUnused;

   if(stat == SLinSolverRational::OK)
   {
#ifdef SOPLEX_WITH_L_ROWS
      setupRowVals();
#endif
      nzCnt = setupColVals();
   }

   factorTime->stop();

   factorCount++;
}